

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Expression_lhs<ApprovalTests::ClipboardReporter_*> *this)

{
  uint uVar1;
  ContextOptions *pCVar2;
  long *in_RSI;
  Result *in_RDI;
  bool res;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  bool local_11;
  
  local_11 = *in_RSI != 0;
  if ((*(uint *)(in_RSI + 1) & 0x100) != 0) {
    local_11 = (bool)((local_11 ^ 0xffU) & 1);
  }
  if ((local_11 != false) && (pCVar2 = getContextOptions(), (pCVar2->success & 1U) == 0)) {
    uVar1 = (uint)local_11;
    String::String((String *)0x1d6bcf);
    Result::Result((Result *)CONCAT44(uVar1,in_stack_ffffffffffffff70),
                   (bool)in_stack_ffffffffffffff6f,(String *)0x1d6be5);
    String::~String((String *)CONCAT44(uVar1,in_stack_ffffffffffffff70));
    return in_RDI;
  }
  toString<ApprovalTests::ClipboardReporter_*,_true>
            ((ClipboardReporter **)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  Result::Result((Result *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (bool)in_stack_ffffffffffffff6f,(String *)0x1d6b8c);
  String::~String((String *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return in_RDI;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only for MSVC 2015
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) { //!OCLINT bitwise operator in conditional
                res = !res;
            }

            if(!res || getContextOptions()->success) {
                return { res, (DOCTEST_STRINGIFY(lhs)) };
            }
            return { res };
        }